

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

void raviX_ptrlist_split_node(PtrList *head)

{
  char cVar1;
  C_MemoryAllocator *pCVar2;
  PtrList *pPVar3;
  char cVar4;
  PtrList *pPVar5;
  int iVar6;
  
  pCVar2 = head->allocator_;
  if (pCVar2 != (C_MemoryAllocator *)0x0) {
    cVar1 = *(char *)head;
    cVar4 = cVar1 / '\x02';
    pPVar5 = (PtrList *)(*pCVar2->calloc)(pCVar2->arena,1,0x58);
    pPVar3 = head->next_;
    iVar6 = (int)cVar1 - (int)cVar4;
    pPVar5->allocator_ = pCVar2;
    *(char *)head = (char)iVar6;
    pPVar5->next_ = pPVar3;
    pPVar3->prev_ = pPVar5;
    pPVar5->prev_ = head;
    head->next_ = pPVar5;
    *(char *)pPVar5 = cVar4;
    memcpy(pPVar5->list_,head->list_ + iVar6,(long)cVar4 << 3);
    memset(head->list_ + iVar6,0xf0,(long)cVar4 << 3);
    return;
  }
  __assert_fail("alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x1c,"void raviX_ptrlist_split_node(PtrList *)");
}

Assistant:

void raviX_ptrlist_split_node(PtrList *head)
{
	int old = head->nr_, nr = old / 2;
	C_MemoryAllocator *alloc = head->allocator_;
	assert(alloc);
	PtrList *newlist = (PtrList *)alloc->calloc(alloc->arena, 1, sizeof(PtrList));
	PtrList *next = head->next_;
	newlist->allocator_ = alloc;

	old -= nr;
	head->nr_ = old;
	newlist->next_ = next;
	next->prev_ = newlist;
	newlist->prev_ = head;
	head->next_ = newlist;
	newlist->nr_ = nr;
	memcpy(newlist->list_, head->list_ + old, nr * sizeof(void *));
	memset(head->list_ + old, 0xf0, nr * sizeof(void *));
}